

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_bezier_to_lines(SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  pointer *ppHVar1;
  value_type *pvVar2;
  Hair *pHVar3;
  iterator iVar4;
  bool bVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  HairSetNode *this_00;
  Hair *hair;
  ulong uVar10;
  Hair *pHVar11;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p;
  value_type *__x;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *this_01;
  Hair local_78;
  long *local_70;
  Node *local_68;
  Ref<embree::SceneGraph::Node> *local_60;
  long *local_58;
  Ref<embree::SceneGraph::MaterialNode> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar6 = (long *)0x0;
  }
  else {
    plVar6 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo);
  }
  if (plVar6 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar7 = (long *)0x0;
    }
    else {
      plVar7 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&MultiTransformNode::typeinfo);
    }
    local_68 = (Node *)this;
    local_60 = node;
    if (plVar7 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar8 = (long *)0x0;
      }
      else {
        plVar8 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GroupNode::typeinfo);
      }
      local_70 = plVar7;
      if (plVar8 == (long *)0x0) {
        if (local_60->ptr == (Node *)0x0) {
          plVar7 = (long *)0x0;
        }
        else {
          plVar7 = (long *)__dynamic_cast(local_60->ptr,&Node::typeinfo,&HairSetNode::typeinfo);
        }
        if (plVar7 != (long *)0x0) {
          (**(code **)(*plVar7 + 0x10))(plVar7);
          local_58 = plVar7;
          this_00 = (HairSetNode *)operator_new(0x118);
          local_50.ptr = (MaterialNode *)plVar7[0x21];
          if (local_50.ptr != (MaterialNode *)0x0) {
            (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
          }
          HairSetNode::HairSetNode
                    (this_00,RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE,&local_50,*(BBox1f *)(plVar7 + 0xd)
                     ,0);
          (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
          if (local_50.ptr != (MaterialNode *)0x0) {
            (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
          }
          __x = (value_type *)plVar7[0xf];
          pvVar2 = (value_type *)plVar7[0x10];
          if (__x != pvVar2) {
            do {
              std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::push_back(&this_00->positions,__x);
              __x = __x + 1;
            } while (__x != pvVar2);
          }
          pHVar11 = (Hair *)local_58[0x1b];
          pHVar3 = (Hair *)local_58[0x1c];
          if (pHVar11 != pHVar3) {
            this_01 = &this_00->hairs;
            do {
              local_78 = *pHVar11;
              iVar4._M_current =
                   (this_00->hairs).
                   super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this_00->hairs).
                  super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                ::_M_realloc_insert<embree::SceneGraph::HairSetNode::Hair>(this_01,iVar4,&local_78);
              }
              else {
                *iVar4._M_current = local_78;
                ppHVar1 = &(this_00->hairs).
                           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppHVar1 = *ppHVar1 + 1;
              }
              local_78.id = pHVar11->id;
              local_78.vertex = pHVar11->vertex + 1;
              iVar4._M_current =
                   (this_00->hairs).
                   super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this_00->hairs).
                  super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                ::_M_realloc_insert<embree::SceneGraph::HairSetNode::Hair>(this_01,iVar4,&local_78);
              }
              else {
                *iVar4._M_current = local_78;
                ppHVar1 = &(this_00->hairs).
                           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppHVar1 = *ppHVar1 + 1;
              }
              local_78.id = pHVar11->id;
              local_78.vertex = pHVar11->vertex + 2;
              iVar4._M_current =
                   (this_00->hairs).
                   super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this_00->hairs).
                  super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                ::_M_realloc_insert<embree::SceneGraph::HairSetNode::Hair>(this_01,iVar4,&local_78);
              }
              else {
                *iVar4._M_current = local_78;
                ppHVar1 = &(this_00->hairs).
                           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppHVar1 = *ppHVar1 + 1;
              }
              pHVar11 = pHVar11 + 1;
            } while (pHVar11 != pHVar3);
          }
          (local_68->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
          (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
          (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
          plVar7 = local_70;
          (**(code **)(*local_58 + 0x18))();
          if (plVar7 == (long *)0x0) {
            bVar5 = false;
            node = local_60;
            this = (SceneGraph *)local_68;
          }
          else {
            (**(code **)(*plVar7 + 0x18))(plVar7);
            bVar5 = false;
            node = local_60;
            this = (SceneGraph *)local_68;
          }
          goto LAB_001523eb;
        }
      }
      else {
        (**(code **)(*plVar8 + 0x10))(plVar8);
        lVar9 = plVar8[0xd];
        if (plVar8[0xe] != lVar9) {
          uVar10 = 0;
          do {
            local_48.ptr = *(Node **)(lVar9 + uVar10 * 8);
            if (local_48.ptr != (Node *)0x0) {
              (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
            }
            convert_bezier_to_lines((SceneGraph *)&local_78,&local_48);
            lVar9 = plVar8[0xd];
            plVar7 = *(long **)(lVar9 + uVar10 * 8);
            if (plVar7 != (long *)0x0) {
              (**(code **)(*plVar7 + 0x18))();
            }
            *(Hair *)(lVar9 + uVar10 * 8) = local_78;
            local_78.vertex = 0;
            local_78.id = 0;
            if (local_48.ptr != (Node *)0x0) {
              (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
            }
            uVar10 = uVar10 + 1;
            lVar9 = plVar8[0xd];
          } while (uVar10 < (ulong)(plVar8[0xe] - lVar9 >> 3));
        }
      }
      plVar7 = local_70;
      if (plVar8 != (long *)0x0) {
        (**(code **)(*plVar8 + 0x18))(plVar8);
      }
    }
    else {
      (**(code **)(*plVar7 + 0x10))(plVar7);
      local_40.ptr = (Node *)plVar7[0x10];
      if (local_40.ptr != (Node *)0x0) {
        (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_bezier_to_lines((SceneGraph *)&local_78,&local_40);
      if ((long *)plVar7[0x10] != (long *)0x0) {
        (**(code **)(*(long *)plVar7[0x10] + 0x18))();
      }
      *(Hair *)(plVar7 + 0x10) = local_78;
      local_78.vertex = 0;
      local_78.id = 0;
      if (local_40.ptr != (Node *)0x0) {
        (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    bVar5 = true;
    node = local_60;
    this = (SceneGraph *)local_68;
    if (plVar7 != (long *)0x0) {
      (**(code **)(*plVar7 + 0x18))(plVar7);
      node = local_60;
      this = (SceneGraph *)local_68;
      bVar5 = true;
    }
  }
  else {
    (**(code **)(*plVar6 + 0x10))(plVar6);
    local_38.ptr = (Node *)plVar6[0x13];
    if (local_38.ptr != (Node *)0x0) {
      (*((local_38.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    convert_bezier_to_lines((SceneGraph *)&local_78,&local_38);
    if ((long *)plVar6[0x13] != (long *)0x0) {
      (**(code **)(*(long *)plVar6[0x13] + 0x18))();
    }
    *(Hair *)(plVar6 + 0x13) = local_78;
    local_78.vertex = 0;
    local_78.id = 0;
    if (local_38.ptr != (Node *)0x0) {
      (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    bVar5 = true;
  }
LAB_001523eb:
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 0x18))(plVar6);
  }
  if (bVar5) {
    (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
    node->ptr = (Node *)0x0;
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_bezier_to_lines(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_bezier_to_lines(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_bezier_to_lines(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_bezier_to_lines(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::HairSetNode> hmesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      Ref<SceneGraph::HairSetNode> lmesh = new SceneGraph::HairSetNode(RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE, hmesh->material, hmesh->time_range, 0);

      for (auto& p : hmesh->positions)
        lmesh->positions.push_back(p);

      for (auto& hair : hmesh->hairs) {
        lmesh->hairs.push_back(SceneGraph::HairSetNode::Hair(hair.vertex+0,hair.id));
        lmesh->hairs.push_back(SceneGraph::HairSetNode::Hair(hair.vertex+1,hair.id));
        lmesh->hairs.push_back(SceneGraph::HairSetNode::Hair(hair.vertex+2,hair.id));
      }
      return lmesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }